

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void pk_record(CHAR_DATA *ch,CHAR_DATA *victim)

{
  short *psVar1;
  PC_DATA *pPVar2;
  int iVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  CHAR_DATA **ppCVar10;
  float fVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  int local_34;
  
  bVar4 = is_npc(victim);
  if ((!bVar4) && (bVar4 = is_npc(ch), !bVar4)) {
    iVar7 = 0;
    ppCVar10 = &char_list;
    local_34 = 0;
    iVar9 = 0;
    while (ppCVar10 = &((CHAR_DATA *)ppCVar10)->next->next,
          (CHAR_DATA *)ppCVar10 != (CHAR_DATA *)0x0) {
      bVar4 = is_same_group((CHAR_DATA *)ppCVar10,ch);
      if (((bVar4) && (bVar4 = is_npc((CHAR_DATA *)ppCVar10), !bVar4)) &&
         ((((CHAR_DATA *)ppCVar10)->in_room == ch->in_room || (0 < ((CHAR_DATA *)ppCVar10)->ghost)))
         ) {
        fmt._M_str = "Adding {} to killer_group";
        fmt._M_len = 0x19;
        CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&((CHAR_DATA *)ppCVar10)->name);
        iVar7 = iVar7 + 1;
      }
      bVar4 = is_same_group((CHAR_DATA *)ppCVar10,ch);
      if (((bVar4) && (((CHAR_DATA *)ppCVar10)->in_room == ch->in_room)) &&
         (bVar4 = is_npc((CHAR_DATA *)ppCVar10), !bVar4)) {
        fmt_00._M_str = "Adding {} to killer_in_room";
        fmt_00._M_len = 0x1b;
        CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt_00,&((CHAR_DATA *)ppCVar10)->name);
        iVar9 = iVar9 + 1;
      }
      bVar4 = is_same_group((CHAR_DATA *)ppCVar10,victim);
      if ((bVar4) &&
         ((((CHAR_DATA *)ppCVar10)->in_room == victim->in_room ||
          (0 < ((CHAR_DATA *)ppCVar10)->ghost)))) {
        fmt_01._M_str = "Adding {} to victim_group.";
        fmt_01._M_len = 0x1a;
        CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt_01,&((CHAR_DATA *)ppCVar10)->name);
        local_34 = local_34 + 1;
      }
    }
    iVar3 = 1;
    if (local_34 / iVar7 < 1) {
      iVar3 = local_34 / iVar7;
    }
    fVar11 = (float)iVar3 / (float)iVar9;
    victim->pcdata->fragged = (float)iVar3 + victim->pcdata->fragged;
    ppCVar10 = &char_list;
LAB_002efad8:
    ppCVar10 = &((CHAR_DATA *)ppCVar10)->next->next;
    if ((CHAR_DATA *)ppCVar10 != (CHAR_DATA *)0x0) {
      bVar4 = is_same_group((CHAR_DATA *)ppCVar10,ch);
      if (((bVar4) && (bVar4 = can_pk((CHAR_DATA *)ppCVar10,victim), bVar4)) &&
         ((bVar4 = is_npc((CHAR_DATA *)ppCVar10), !bVar4 &&
          (((CHAR_DATA *)ppCVar10)->in_room == ch->in_room)))) {
        ((CHAR_DATA *)ppCVar10)->pcdata->frags[0] =
             ((CHAR_DATA *)ppCVar10)->pcdata->frags[0] + fVar11;
        bVar4 = is_good(victim);
        lVar6 = 0xa0;
        if (bVar4) {
LAB_002efb6e:
          *(float *)((long)&((CHAR_DATA *)ppCVar10)->pcdata->next + lVar6) =
               *(float *)((long)&((CHAR_DATA *)ppCVar10)->pcdata->next + lVar6) + fVar11;
        }
        else {
          bVar4 = is_neutral(victim);
          lVar6 = 0xa4;
          if (bVar4) goto LAB_002efb6e;
          bVar4 = is_evil(victim);
          lVar6 = 0xa8;
          if (bVar4) goto LAB_002efb6e;
        }
        if (((CHAR_DATA *)ppCVar10)->level < 0x33) {
          for (uVar8 = 0; uVar8 != 100; uVar8 = uVar8 + 1) {
            pcVar5 = ((CHAR_DATA *)ppCVar10)->pcdata->recentkills[uVar8];
            if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
              if (uVar8 < 0x5f) {
                pcVar5 = palloc_string(victim->name);
                ((CHAR_DATA *)ppCVar10)->pcdata->recentkills[uVar8] = pcVar5;
              }
              break;
            }
          }
        }
      }
      goto LAB_002efad8;
    }
    pPVar2 = ch->pcdata;
    pPVar2->kills[0] = pPVar2->kills[0] + 1;
    if (victim->alignment < 1) {
      if (victim->alignment == 0) {
        pPVar2->kills[2] = pPVar2->kills[2] + 1;
      }
      else {
        pPVar2->kills[3] = pPVar2->kills[3] + 1;
      }
    }
    else {
      pPVar2->kills[1] = pPVar2->kills[1] + 1;
    }
    psVar1 = victim->pcdata->killed;
    *psVar1 = *psVar1 + 1;
    if (ch->level < 0x33) {
      for (uVar8 = 0; uVar8 != 100; uVar8 = uVar8 + 1) {
        if ((pPVar2->recentkills[uVar8] == (char *)0x0) || (*pPVar2->recentkills[uVar8] == '\0')) {
          if (0x5e < uVar8) {
            return;
          }
          pcVar5 = palloc_string(victim->name);
          ch->pcdata->recentkills[uVar8] = pcVar5;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void pk_record(CHAR_DATA *ch, CHAR_DATA *victim)
{
	CHAR_DATA *wch;
	int killer_group = 0, victim_group = 0;
	int killer_in_room = 0;
	float killer_credit, victim_credit;
	int i;

	if (is_npc(victim) || is_npc(ch))
		return;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && !is_npc(wch) && (wch->in_room == ch->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to killer_group", wch->name);
			killer_group++;
		}

		if (is_same_group(wch, ch) && wch->in_room == ch->in_room && !is_npc(wch))
		{
			RS.Logger.Info("Adding {} to killer_in_room", wch->name);
			killer_in_room++;
		}

		if (is_same_group(wch, victim) && (wch->in_room == victim->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to victim_group.", wch->name);
			victim_group++;
		}
	}

	victim_credit = (float)(victim_group / killer_group);

	if (victim_credit > 1)
		victim_credit = 1;

	killer_credit = victim_credit;
	killer_credit = killer_credit / killer_in_room;
	victim->pcdata->fragged += victim_credit;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && can_pk(wch, victim) && !is_npc(wch) && wch->in_room == ch->in_room)
		{
			wch->pcdata->frags[PK_KILLS] += killer_credit;

			if (is_good(victim))
				wch->pcdata->frags[PK_GOOD] += killer_credit;
			else if (is_neutral(victim))
				wch->pcdata->frags[PK_NEUTRAL] += killer_credit;
			else if (is_evil(victim))
				wch->pcdata->frags[PK_EVIL] += killer_credit;

			if (wch->level < 51)
			{
				for (i = 0; i < 100; i++)
				{
					if (wch->pcdata->recentkills[i] == nullptr)
						break;

					if (*(wch->pcdata->recentkills[i]) == '\0')
						break;
				}

				if (i < 95)
					wch->pcdata->recentkills[i] = palloc_string(victim->name);
			}
		}
	}

	ch->pcdata->kills[PK_KILLS]++;

	if (victim->alignment > 0)
		ch->pcdata->kills[PK_GOOD]++;
	else if (victim->alignment == 0)
		ch->pcdata->kills[PK_NEUTRAL]++;
	else if (victim->alignment < 0)
		ch->pcdata->kills[PK_EVIL]++;

	victim->pcdata->killed[PK_KILLED]++;

	if (ch->level < 51)
	{
		for (i = 0; i < 100; i++)
		{
			if (ch->pcdata->recentkills[i] == nullptr)
				break;

			if (*(ch->pcdata->recentkills[i]) == '\0')
				break;
		}

		if (i < 95)
			ch->pcdata->recentkills[i] = palloc_string(victim->name);
	}
}